

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O0

void * QRunnable::QGenericRunnable::
       Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5)>
       ::impl(Op op,HelperBase *that,void *arg)

{
  void *in_RSI;
  int in_EDI;
  Helper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4952:5)>
  *_this;
  anon_class_24_4_b418dff8_for_o *in_stack_ffffffffffffffd0;
  
  if (in_EDI == 0) {
    QtPrivate::detail::
    StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5),_void>
    ::object((StorageByValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4952:5),_void>
              *)((long)in_RSI + 8));
    QtPrivate::detail::
    StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5),_void>
    ::anon_class_24_4_b418dff8_for_o::operator()(in_stack_ffffffffffffffd0);
  }
  else if ((in_EDI == 1) && (in_RSI != (void *)0x0)) {
    operator_delete(in_RSI,0x20);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }